

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

pair<const_char_*,_unsigned_long> plot::utf8_clamp<char_const*>(char *first,char *last,size_t width)

{
  char32_t __c;
  int iVar1;
  undefined4 extraout_var;
  unsigned_long local_48;
  ulong local_40;
  size_t cw;
  size_t request;
  size_t width_local;
  char *last_local;
  char *first_local;
  
  cw = width;
  request = width;
  width_local = (size_t)last;
  for (last_local = first; last_local != (char *)width_local;
      last_local = detail::utf8_next<char_const*>(last_local,(char *)width_local)) {
    __c = detail::utf8_cp<char_const*>(last_local,(char *)width_local);
    iVar1 = detail::wcwidth(__c);
    local_40 = CONCAT44(extraout_var,iVar1);
    if (request < local_40) break;
    request = request - local_40;
  }
  local_48 = cw - request;
  std::pair<const_char_*,_unsigned_long>::pair<const_char_*&,_unsigned_long,_true>
            ((pair<const_char_*,_unsigned_long> *)&first_local,&last_local,&local_48);
  return _first_local;
}

Assistant:

std::pair<Iterator, std::size_t> utf8_clamp(Iterator first, Iterator last, std::size_t width) {
    std::size_t request = width;

    for (; first != last; first = detail::utf8_next(first, last)) {
        auto cw = detail::wcwidth(detail::utf8_cp(first, last));
        if (cw > width)
            break;
        width -= cw;
    }

    return { first, request - width };
}